

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock_or_throw.h
# Opt level: O2

void tools::do_check<cpp_db::connection_interface>
               (weak_ptr<cpp_db::connection_interface> *ptr,char *context)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  runtime_error *this;
  char *pcVar2;
  
  p_Var1 = (ptr->super___weak_ptr<cpp_db::connection_interface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) && (p_Var1->_M_use_count != 0)
     ) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  pcVar2 = "Invalid pointer!";
  if (context != (char *)0x0) {
    pcVar2 = context;
  }
  std::runtime_error::runtime_error(this,pcVar2);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void do_check(const std::weak_ptr<T> &ptr, const char *context)
{
	if (ptr.expired())
		throw std::runtime_error(context ? context : "Invalid pointer!");
}